

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void DnsStats::GetSourceAddress(int ip_type,uint8_t *ip_header,uint8_t **addr,size_t *addr_length)

{
  size_t sVar1;
  
  sVar1 = 0x10;
  if (ip_type == 4) {
    sVar1 = 4;
  }
  *addr = ip_header + (ulong)(ip_type == 4) * 4 + 8;
  *addr_length = sVar1;
  return;
}

Assistant:

void DnsStats::GetSourceAddress(int ip_type, uint8_t * ip_header, uint8_t ** addr, size_t * addr_length)
{
    if (ip_type == 4)
    {
        *addr = ip_header + 12;
        *addr_length = 4;
    }
    else
    {
        *addr = ip_header + 8;
        *addr_length = 16;
    }
}